

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

UBool __thiscall
icu_63::UnicodeString::endsWith(UnicodeString *this,ConstChar16Ptr *srcChars,int32_t srcLength)

{
  short sVar1;
  int8_t iVar2;
  int iVar3;
  
  if (srcLength < 0) {
    srcLength = u_strlen_63(srcChars->p_);
  }
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (this->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  iVar2 = doCompare(this,iVar3 - srcLength,srcLength,srcChars->p_,0,srcLength);
  return iVar2 == '\0';
}

Assistant:

inline UBool
UnicodeString::endsWith(ConstChar16Ptr srcChars,
            int32_t srcLength) const {
  if(srcLength < 0) {
    srcLength = u_strlen(toUCharPtr(srcChars));
  }
  return doCompare(length() - srcLength, srcLength,
                   srcChars, 0, srcLength) == 0;
}